

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

void __thiscall
GraphMaker::new_graph_from_paired_datastore
          (GraphMaker *this,PairedReadsDatastore *ds,int k,int min_coverage,int num_batches)

{
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  PairedReadsDatastore *in_stack_00000098;
  uint8_t in_stack_00000fc7;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *in_stack_00000fc8;
  GraphMaker *in_stack_00000fd0;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *in_stack_ffffffffffffffc0;
  
  BatchKmersCounter::countKmersToList
            (in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_0000008c);
  new_graph_from_kmerlist_128(in_stack_00000fd0,in_stack_00000fc8,in_stack_00000fc7);
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::~vector
            (in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void GraphMaker::new_graph_from_paired_datastore(const PairedReadsDatastore& ds,  int k, int min_coverage, int num_batches) {
    new_graph_from_kmerlist_128(BatchKmersCounter::countKmersToList(ds, k, min_coverage, num_batches),k);
}